

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

LY_ERR lyxml_parse_identifier(lyxml_ctx *xmlctx,char **start,char **end)

{
  LY_ERR LVar1;
  bool local_4e;
  size_t sStack_48;
  LY_ERR rc;
  size_t parsed;
  char *pcStack_38;
  uint32_t c;
  char *in;
  char *s;
  char **end_local;
  char **start_local;
  lyxml_ctx *xmlctx_local;
  
  pcStack_38 = xmlctx->in->current;
  in = pcStack_38;
  s = (char *)end;
  end_local = start;
  start_local = (char **)xmlctx;
  LVar1 = ly_getutf8(&stack0xffffffffffffffc8,(uint32_t *)((long)&parsed + 4),
                     &stack0xffffffffffffffb8);
  if (LVar1 == LY_SUCCESS) {
    if ((((((((parsed._4_4_ < 0x61) || (0x7a < parsed._4_4_)) && (parsed._4_4_ != 0x5f)) &&
           ((parsed._4_4_ < 0x41 || (0x5a < parsed._4_4_)))) &&
          ((parsed._4_4_ < 0x370 || ((0x1fff < parsed._4_4_ || (parsed._4_4_ == 0x37e)))))) &&
         ((parsed._4_4_ < 0xc0 ||
          (((0x2ff < parsed._4_4_ || (parsed._4_4_ == 0xd7)) || (parsed._4_4_ == 0xf7)))))) &&
        ((((parsed._4_4_ != 0x200c && (parsed._4_4_ != 0x200d)) &&
          ((parsed._4_4_ < 0x2070 || (0x218f < parsed._4_4_)))) &&
         ((parsed._4_4_ < 0x2c00 || (0x2fef < parsed._4_4_)))))) &&
       (((parsed._4_4_ < 0x3001 || (0xd7ff < parsed._4_4_)) &&
        ((((parsed._4_4_ < 0xf900 || (0xfdcf < parsed._4_4_)) &&
          ((parsed._4_4_ < 0xfdf0 || (0xfffd < parsed._4_4_)))) &&
         ((parsed._4_4_ < 0x10000 || (0xeffff < parsed._4_4_)))))))) {
      ly_vlog((ly_ctx *)*start_local,(char *)0x0,LYVE_SYNTAX,
              "Identifier \"%s\" starts with an invalid character.",(long)pcStack_38 - sStack_48);
      xmlctx_local._4_4_ = LY_EVALID;
    }
    else {
      do {
        ly_in_skip((ly_in *)start_local[1],sStack_48);
        LVar1 = ly_getutf8(&stack0xffffffffffffffc8,(uint32_t *)((long)&parsed + 4),
                           &stack0xffffffffffffffb8);
        if (LVar1 != LY_SUCCESS) {
          ly_vlog((ly_ctx *)*start_local,(char *)0x0,LYVE_SYNTAX,"Invalid character 0x%hhx.",
                  (ulong)(uint)(int)*pcStack_38);
          return LY_EVALID;
        }
        if (((((((parsed._4_4_ < 0x61) || (local_4e = true, 0x7a < parsed._4_4_)) &&
               (local_4e = true, parsed._4_4_ != 0x5f)) &&
              ((local_4e = true, parsed._4_4_ != 0x2d &&
               ((parsed._4_4_ < 0x41 || (local_4e = true, 0x5a < parsed._4_4_)))))) &&
             ((((parsed._4_4_ < 0x30 || (local_4e = true, 0x39 < parsed._4_4_)) &&
               (((local_4e = true, parsed._4_4_ != 0x2e && (local_4e = true, parsed._4_4_ != 0xb7))
                && ((parsed._4_4_ < 0x370 ||
                    ((0x1fff < parsed._4_4_ || (local_4e = true, parsed._4_4_ == 0x37e)))))))) &&
              ((parsed._4_4_ < 0xc0 ||
               (((0x2ff < parsed._4_4_ || (parsed._4_4_ == 0xd7)) ||
                (local_4e = true, parsed._4_4_ == 0xf7)))))))) &&
            ((((local_4e = true, parsed._4_4_ != 0x200c && (local_4e = true, parsed._4_4_ != 0x200d)
               ) && ((parsed._4_4_ < 0x300 || (local_4e = true, 0x36f < parsed._4_4_)))) &&
             (((parsed._4_4_ < 0x2070 || (local_4e = true, 0x218f < parsed._4_4_)) &&
              ((parsed._4_4_ < 0x203f || (local_4e = true, 0x2040 < parsed._4_4_)))))))) &&
           (((((parsed._4_4_ < 0x2c00 || (local_4e = true, 0x2fef < parsed._4_4_)) &&
              ((parsed._4_4_ < 0x3001 || (local_4e = true, 0xd7ff < parsed._4_4_)))) &&
             ((parsed._4_4_ < 0xf900 || (local_4e = true, 0xfdcf < parsed._4_4_)))) &&
            ((parsed._4_4_ < 0xfdf0 || (local_4e = true, 0xfffd < parsed._4_4_)))))) {
          local_4e = 0xffff < parsed._4_4_ && parsed._4_4_ < 0xf0000;
        }
      } while (local_4e);
      *end_local = in;
      *(undefined8 *)s = *(undefined8 *)(start_local[1] + 8);
      xmlctx_local._4_4_ = LY_SUCCESS;
    }
  }
  else {
    ly_vlog((ly_ctx *)*start_local,(char *)0x0,LYVE_SYNTAX,"Invalid character 0x%hhx.",
            (ulong)(uint)(int)*pcStack_38);
    xmlctx_local._4_4_ = LY_EVALID;
  }
  return xmlctx_local._4_4_;
}

Assistant:

static LY_ERR
lyxml_parse_identifier(struct lyxml_ctx *xmlctx, const char **start, const char **end)
{
    const char *s, *in;
    uint32_t c;
    size_t parsed;
    LY_ERR rc;

    in = s = xmlctx->in->current;

    /* check NameStartChar (minus colon) */
    LY_CHECK_ERR_RET(ly_getutf8(&in, &c, &parsed),
            LOGVAL(xmlctx->ctx, LY_VCODE_INCHAR, in[0]),
            LY_EVALID);
    LY_CHECK_ERR_RET(!is_xmlqnamestartchar(c),
            LOGVAL(xmlctx->ctx, LYVE_SYNTAX, "Identifier \"%s\" starts with an invalid character.", in - parsed),
            LY_EVALID);

    /* check rest of the identifier */
    do {
        /* move only successfully parsed bytes */
        ly_in_skip(xmlctx->in, parsed);

        rc = ly_getutf8(&in, &c, &parsed);
        LY_CHECK_ERR_RET(rc, LOGVAL(xmlctx->ctx, LY_VCODE_INCHAR, in[0]), LY_EVALID);
    } while (is_xmlqnamechar(c));

    *start = s;
    *end = xmlctx->in->current;
    return LY_SUCCESS;
}